

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_ref.cpp
# Opt level: O0

ON_SubDComponentRef * __thiscall
ON_SubDComponentRefList::Append(ON_SubDComponentRefList *this,ON_SubDComponentRef *src_ref)

{
  bool bVar1;
  ON_SubD *this_00;
  ON_SubDComponentRef *this_01;
  ON_SubDComponentRef **ppOVar2;
  ON_SubDComponentRef *local_28;
  ON_SubDComponentRef *local_20;
  ON_SubDComponentRef *src_ref_local;
  ON_SubDComponentRefList *this_local;
  
  if (src_ref != (ON_SubDComponentRef *)0x0) {
    local_20 = src_ref;
    src_ref_local = (ON_SubDComponentRef *)this;
    this_00 = ON_SubDComponentRef::SubD(src_ref);
    bVar1 = ON_SubD::IsEmpty(this_00);
    if ((!bVar1) && (bVar1 = Internal_UpdateCount(this,local_20,1), bVar1)) {
      this_01 = (ON_SubDComponentRef *)operator_new(0x40);
      ON_SubDComponentRef::ON_SubDComponentRef(this_01,local_20);
      local_28 = this_01;
      ON_SimpleArray<ON_SubDComponentRef_*>::Append(&this->m_list,&local_28);
      this->m_bIsClean = false;
      ppOVar2 = ON_SimpleArray<ON_SubDComponentRef_*>::Last(&this->m_list);
      return *ppOVar2;
    }
  }
  this_local = (ON_SubDComponentRefList *)&ON_SubDComponentRef::Empty;
  return (ON_SubDComponentRef *)this_local;
}

Assistant:

const ON_SubDComponentRef& ON_SubDComponentRefList::Append(const ON_SubDComponentRef* src_ref)
{
  for (;;)
  {
    if (nullptr == src_ref)
      break;
    if (src_ref->SubD().IsEmpty())
      break;
    if (false == Internal_UpdateCount(*src_ref,1))
      break;
    m_list.Append(new ON_SubDComponentRef(*src_ref));
    m_bIsClean = false;
    return **(m_list.Last());
  }
  return ON_SubDComponentRef::Empty;
}